

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O3

void __thiscall
afsm::test::TranFSM_AllEvents_Test::~TranFSM_AllEvents_Test(TranFSM_AllEvents_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TranFSM, AllEvents)
{
    using actions::event_process_result;
    using ::psst::ansi_color;
    connection_fsm fsm;
    fsm.make_observer("connection_fsm_def");

    ::std::cerr << fsm.get_state< connection_fsm_def >().name() << "\n";
    ::std::cerr << fsm.get_state< connection_fsm::transaction >().name() << "\n";
    ::std::cerr << fsm.get_state< connection_fsm::transaction::simple_query >().name() << "\n";

    EXPECT_EQ(event_process_result::process, fsm.process_event(events::connect{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::connecting>());
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::complete{}));
    EXPECT_FALSE(fsm.is_in_state<connection_fsm_def::connecting>());
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::authorizing>());
    EXPECT_FALSE(fsm.is_in_state<connection_fsm_def::idle>());
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::idle>());

    begin_transaction(fsm);

    // Simple query sequence
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::execute{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query>());
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query::waiting>());
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::row_description{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query>());
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query::fetch_data>());
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    commit_transaction(fsm);

    begin_transaction(fsm);

    // Extended query no data sequence
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::exec_prepared{}));
    // parse -> parse
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::no_data{}));
    // parse -> bind
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // bind -> exec
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // exec -> idle
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    commit_transaction(fsm);

    // Terminate connection
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::terminate{}));
}